

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O2

string * __thiscall
datadog::Dogstatsd::format
          (string *__return_storage_ptr__,Dogstatsd *this,string *name,string *value,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tags,double rate)

{
  ostream *poVar1;
  pointer pbVar2;
  char *pcVar3;
  ostringstream statd;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,(string *)name);
  poVar1 = std::operator<<(poVar1,":");
  std::operator<<(poVar1,(string *)value);
  if (rate < 1.0) {
    std::operator<<((ostream *)local_1a8,"|@");
    std::ostream::_M_insert<double>(rate);
  }
  pbVar2 = (tags->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((tags->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar2) {
    if ((this->global_tags_str)._M_string_length == 0) goto LAB_001043b0;
    pcVar3 = "|#";
  }
  else {
    poVar1 = std::operator<<((ostream *)local_1a8,"|#");
    std::operator<<(poVar1,(string *)pbVar2);
    pcVar3 = ",";
    while (pbVar2 = pbVar2 + 1,
          pbVar2 != (tags->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
      poVar1 = std::operator<<((ostream *)local_1a8,",");
      std::operator<<(poVar1,(string *)pbVar2);
    }
    if ((this->global_tags_str)._M_string_length == 0) goto LAB_001043b0;
  }
  std::operator<<((ostream *)local_1a8,pcVar3);
  std::operator<<((ostream *)local_1a8,(string *)&this->global_tags_str);
LAB_001043b0:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Dogstatsd::format( std::string name, std::string value, std::vector<std::string> tags, double rate){
    bool tagging = false;
    std::ostringstream statd;

    statd << name << ":" << value;
    if (rate < 1) {
      statd << "|@" << rate;
    }

    if (tags.size()) {
      tagging = true;
      // TODO: remove newlines from the tags.
      std::vector<std::string>::iterator it = tags.begin();

      statd << "|#" << *it++;
      for( ; it != tags.end() ; ++it) {
        statd << "," << *it;
      }
    }

    if (!global_tags_str.empty()) {
      if (!tagging) {
        statd << "|#" ;
      } else {
        statd << "," ;
      }
      statd << global_tags_str;
    }
    return statd.str();
  }